

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_readCTable
                 (HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                 uint *hasZeroWeights)

{
  int iVar1;
  size_t sVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  U32 nbSymbols;
  U32 tableLog;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 rankVal [13];
  BYTE huffWeight [256];
  U32 local_1a0;
  U32 local_19c;
  ushort auStack_198 [16];
  short asStack_178 [16];
  U32 local_158;
  int aiStack_154 [15];
  BYTE local_118 [256];
  
  local_19c = 0;
  local_1a0 = 0;
  sVar2 = HUF_readStats(local_118,0x100,&local_158,&local_1a0,&local_19c,src,srcSize);
  sVar7 = sVar2;
  if (sVar2 < 0xffffffffffffff89) {
    *hasZeroWeights = (uint)(local_158 != 0);
    uVar9 = (ulong)local_19c;
    sVar7 = 0xffffffffffffffd4;
    if (uVar9 < 0xd) {
      uVar8 = (ulong)local_1a0;
      sVar7 = 0xffffffffffffffd0;
      if (local_1a0 <= *maxSymbolValuePtr + 1) {
        *maxSymbolValuePtr = local_1a0 - 1;
        *(char *)CTable = (char)local_19c;
        *(char *)((long)CTable + 1) = (char)(local_1a0 - 1);
        *(undefined4 *)((long)CTable + 2) = 0;
        *(undefined2 *)((long)CTable + 6) = 0;
        if (local_19c != 0) {
          uVar5 = 0;
          iVar10 = 0;
          do {
            iVar1 = aiStack_154[uVar5];
            bVar3 = (byte)uVar5;
            aiStack_154[uVar5] = iVar10;
            uVar5 = uVar5 + 1;
            iVar10 = (iVar1 << (bVar3 & 0x1f)) + iVar10;
          } while (uVar9 != uVar5);
        }
        if (uVar8 != 0) {
          uVar5 = 0;
          do {
            uVar11 = (uint)(byte)(((char)local_19c + '\x01') - local_118[uVar5]);
            if (local_118[uVar5] == '\0') {
              uVar11 = 0;
            }
            CTable[uVar5 + 1] = (ulong)uVar11;
            uVar5 = uVar5 + 1;
          } while (uVar8 != uVar5);
        }
        asStack_178[8] = 0;
        asStack_178[9] = 0;
        asStack_178[10] = 0;
        asStack_178[0xb] = 0;
        asStack_178[0xc] = 0;
        asStack_178[0xd] = 0;
        asStack_178[0] = 0;
        asStack_178[1] = 0;
        asStack_178[2] = 0;
        asStack_178[3] = 0;
        asStack_178[4] = 0;
        asStack_178[5] = 0;
        asStack_178[6] = 0;
        asStack_178[7] = 0;
        auStack_198[8] = 0;
        auStack_198[9] = 0;
        auStack_198[10] = 0;
        auStack_198[0xb] = 0;
        auStack_198[0xc] = 0;
        auStack_198[0xd] = 0;
        auStack_198[0] = 0;
        auStack_198[1] = 0;
        auStack_198[2] = 0;
        auStack_198[3] = 0;
        auStack_198[4] = 0;
        auStack_198[5] = 0;
        auStack_198[6] = 0;
        auStack_198[7] = 0;
        if (uVar8 != 0) {
          uVar5 = 0;
          do {
            asStack_178[(byte)CTable[uVar5 + 1]] = asStack_178[(byte)CTable[uVar5 + 1]] + 1;
            uVar5 = uVar5 + 1;
          } while (uVar8 != uVar5);
        }
        auStack_198[uVar9 + 1] = 0;
        if (local_19c != 0) {
          uVar4 = 0;
          do {
            auStack_198[uVar9] = uVar4;
            uVar4 = (ushort)(uVar4 + asStack_178[uVar9]) >> 1;
            uVar9 = uVar9 - 1;
            local_19c = local_19c - 1;
          } while (local_19c != 0);
        }
        sVar7 = sVar2;
        if (uVar8 != 0) {
          uVar9 = 0;
          do {
            uVar5 = CTable[uVar9 + 1];
            uVar6 = uVar5 & 0xff;
            uVar4 = auStack_198[uVar6];
            auStack_198[uVar6] = uVar4 + 1;
            if (uVar6 != 0) {
              CTable[uVar9 + 1] = (ulong)uVar4 << (-(char)uVar5 & 0x3fU) | uVar5;
            }
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
      }
    }
  }
  return sVar7;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    HUF_CElt* const ct = CTable + 1;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));
    *hasZeroWeights = (rankVal[0] > 0);

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    *maxSymbolValuePtr = nbSymbols - 1;

    HUF_writeCTableHeader(CTable, tableLog, *maxSymbolValuePtr);

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 curr = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = curr;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            HUF_setNbBits(ct + n, (BYTE)(tableLog + 1 - w) & -(w != 0));
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[HUF_getNbBits(ct[n])]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) HUF_setValue(ct + n, valPerRank[HUF_getNbBits(ct[n])]++); }
    }

    return readSize;
}